

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_short,signed_char>
          (BaseAppender *this,Vector *col,unsigned_short input)

{
  bool bVar1;
  unkbyte10 Var2;
  char result;
  data_t local_39;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_short,signed_char>(input,(int8_t *)&local_39,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_39;
    return;
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_short,signed_char>
            (&local_38,(duckdb *)(ulong)input,(unsigned_short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}